

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void __thiscall
pbrt::BilinearPatch::BilinearPatch
          (BilinearPatch *this,BilinearPatchMesh *mesh,int meshIndex,int blpIndex)

{
  undefined1 auVar1 [16];
  Point3<float> p_00;
  Point3<float> p_01;
  Vector3<float> v_00;
  Vector3<float> v_01;
  Point3<float> p2;
  Point3<float> p1;
  Point3<float> p1_00;
  Tuple3<pbrt::Point3,_float> t1;
  Tuple3<pbrt::Point3,_float> t1_00;
  Tuple3<pbrt::Point3,_float> t1_01;
  Tuple3<pbrt::Point3,_float> t0;
  Tuple3<pbrt::Point3,_float> t0_00;
  Tuple3<pbrt::Point3,_float> t0_01;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  undefined4 *in_RDI;
  long *in_FS_OFFSET;
  type tVar5;
  type tVar6;
  undefined8 uVar12;
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point3<float> PVar14;
  Vector3<float> VVar15;
  BilinearPatchMesh *in_stack_00000080;
  BilinearPatch *in_stack_00000088;
  int j_1;
  int i_1;
  Float v_1;
  int j;
  Float u;
  int i;
  Point3f p [4] [4];
  int na;
  Point3f p11;
  Point3f p01;
  Point3f p10;
  Point3f p00;
  int *v;
  Point3<float> *in_stack_fffffffffffffc28;
  undefined8 *puVar16;
  undefined8 *puVar17;
  uint uVar18;
  float fVar19;
  float in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffca0;
  Float in_stack_fffffffffffffcc4;
  undefined8 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffd00;
  int local_2c8;
  int local_2c4;
  int local_1a4;
  int local_19c;
  undefined8 local_198;
  float afStack_190 [46];
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined4 local_24;
  int *local_20;
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  
  *in_RDI = in_EDX;
  in_RDI[1] = in_ECX;
  *(long *)(*in_FS_OFFSET + -0x480) = *(long *)(*in_FS_OFFSET + -0x480) + 0xc;
  local_20 = (int *)(*(long *)(in_RSI + 0x10) + (long)(in_ECX << 2) * 4);
  puVar3 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)*local_20 * 0xc);
  local_2c = *puVar3;
  local_24 = *(undefined4 *)(puVar3 + 1);
  puVar3 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_20[1] * 0xc);
  local_38 = *puVar3;
  local_30 = *(undefined4 *)(puVar3 + 1);
  puVar3 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_20[2] * 0xc);
  local_44 = *puVar3;
  local_3c = *(undefined4 *)(puVar3 + 1);
  puVar3 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_20[3] * 0xc);
  local_50 = *puVar3;
  local_48 = *(undefined4 *)(puVar3 + 1);
  bVar2 = IsRectangle(in_stack_00000088,in_stack_00000080);
  if (bVar2) {
    local_58 = local_24;
    local_60 = local_2c;
    local_68 = local_3c;
    local_70 = local_44;
    local_78 = local_24;
    local_80 = local_2c;
    local_88 = local_3c;
    local_90 = local_44;
    p1.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffca0;
    p1.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc98;
    p1.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    PVar14.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc80;
    PVar14.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
    PVar14.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    tVar6 = Distance<float>(p1,PVar14);
    local_98 = local_24;
    local_a0 = local_2c;
    local_a8 = local_30;
    local_b0 = local_38;
    local_b8 = local_24;
    local_c0 = local_2c;
    local_c8 = local_30;
    local_d0 = local_38;
    p1_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffca0;
    p1_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc98;
    p1_00.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    p2.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc80;
    p2.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
    p2.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    tVar5 = Distance<float>(p1_00,p2);
    in_RDI[2] = tVar6 * tVar5;
  }
  else {
    uStack_d8._4_4_ = 3;
    puVar3 = &local_198;
    puVar17 = &uStack_d8;
    do {
      puVar16 = puVar3;
      Point3<float>::Point3((Point3<float> *)0x466147);
      puVar3 = (undefined8 *)((long)puVar16 + 0xc);
    } while (puVar3 != puVar17);
    for (local_19c = 0; fVar19 = SUB84(puVar3,0), local_19c < 4; local_19c = local_19c + 1) {
      for (local_1a4 = 0; uVar18 = (uint)puVar3, local_1a4 < 4; local_1a4 = local_1a4 + 1) {
        auVar13 = (undefined1  [56])0x0;
        t0.z = in_stack_fffffffffffffd00;
        t0.x = (float)(int)in_stack_fffffffffffffcf8;
        t0.y = (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        t1.z = in_stack_fffffffffffffce0;
        t1.x = (float)(int)in_stack_fffffffffffffcd8;
        t1.y = (float)(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        PVar14 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffcc4,t0,t1);
        auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar7._8_56_ = auVar13;
        vmovlpd_avx(auVar7._0_16_);
        uVar12 = 0;
        t0_00.z = in_stack_fffffffffffffd00;
        t0_00.x = (float)(int)in_stack_fffffffffffffcf8;
        t0_00.y = (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        t1_00.z = in_stack_fffffffffffffce0;
        t1_00.x = (float)(int)in_stack_fffffffffffffcd8;
        t1_00.y = (float)(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        PVar14 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffcc4,t0_00,t1_00);
        in_stack_fffffffffffffc28 = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar13 = (undefined1  [56])0x0;
        auVar1._8_8_ = uVar12;
        auVar1._0_8_ = in_stack_fffffffffffffc28;
        vmovlpd_avx(auVar1);
        t0_01.z = in_stack_fffffffffffffd00;
        t0_01.x = (float)(int)in_stack_fffffffffffffcf8;
        t0_01.y = (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        t1_01.z = in_stack_fffffffffffffce0;
        t1_01.x = (float)(int)in_stack_fffffffffffffcd8;
        t1_01.y = (float)(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        PVar14 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffcc4,t0_01,t1_01);
        puVar3 = (undefined8 *)(ulong)uVar18;
        auVar8._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar8._8_56_ = auVar13;
        uVar12 = vmovlpd_avx(auVar8._0_16_);
        puVar4 = (undefined8 *)((long)&local_198 + (long)local_1a4 * 0xc + (long)local_19c * 0x30);
        *puVar4 = uVar12;
        *(float *)(puVar4 + 1) = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
      }
    }
    in_RDI[2] = 0;
    for (local_2c4 = 0; local_2c4 < 3; local_2c4 = local_2c4 + 1) {
      for (local_2c8 = 0; local_2c8 < 3; local_2c8 = local_2c8 + 1) {
        auVar13 = ZEXT856(0);
        p_00.super_Tuple3<pbrt::Point3,_float>.z = SUB84(puVar17,0);
        p_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar16;
        VVar15 = Point3<float>::operator-(in_stack_fffffffffffffc28,p_00);
        auVar9._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar13;
        vmovlpd_avx(auVar9._0_16_);
        auVar13 = ZEXT856(0);
        p_01.super_Tuple3<pbrt::Point3,_float>.z = SUB84(puVar17,0);
        p_01.super_Tuple3<pbrt::Point3,_float>._0_8_ = puVar16;
        VVar15 = Point3<float>::operator-(in_stack_fffffffffffffc28,p_01);
        auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar13;
        vmovlpd_avx(auVar10._0_16_);
        auVar13 = ZEXT856(0);
        v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc68;
        v_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_RDI;
        VVar15.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)puVar17;
        VVar15.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)puVar16 >> 0x20);
        VVar15.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)puVar17 >> 0x20);
        VVar15 = Cross<float>(v_01,VVar15);
        auVar11._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar13;
        uVar12 = vmovlpd_avx(auVar11._0_16_);
        in_stack_fffffffffffffc68 = (float)uVar12;
        v_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar19;
        v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar17;
        tVar6 = Length<float>(v_00);
        in_RDI[2] = tVar6 * 0.5 + (float)in_RDI[2];
      }
    }
  }
  return;
}

Assistant:

BilinearPatch::BilinearPatch(const BilinearPatchMesh *mesh, int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]];
    Point3f p01 = mesh->p[v[2]], p11 = mesh->p[v[3]];

    if (IsRectangle(mesh))
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}